

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

void __thiscall
Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void>::Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void> *this,int *time_,
          function<void_()> *func_)

{
  std::function<void_()>::function(&this->m_callable,func_);
  this->m_running = (__atomic_base<bool>)0x0;
  this->m_got_stopped = (__atomic_base<bool>)0x0;
  (this->m_timer_thread)._M_id._M_thread = 0;
  (this->m_cycle_time).__r = (long)*time_;
  std::condition_variable::condition_variable(&this->m_cond_cycle);
  *(undefined8 *)((long)&(this->m_cycle_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_cycle_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_cycle_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_cycle_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_cycle_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

Timer(const int &time_, const std::function<F(void)> &func_)
      : m_cycle_time(Duration(time_)), m_callable(func_), m_cond_cycle(),
        m_cycle_mutex(){}